

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

uint16_t icu_63::getExtName(uint32_t code,char *buffer,uint16_t bufferLength)

{
  char cVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  char *pcVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char cVar10;
  short sVar11;
  
  bVar2 = getCharCat(code);
  if (bVar2 < 0x21) {
    pcVar5 = (&charCatNames)[bVar2];
  }
  else {
    pcVar5 = "unknown";
  }
  if (bufferLength == 0) {
    sVar11 = 0;
  }
  else {
    *buffer = '<';
    buffer = buffer + 1;
    sVar11 = bufferLength - 1;
  }
  sVar3 = 3;
  while (pcVar5[(ulong)(ushort)(sVar3 - 2) - 1] != '\0') {
    if (sVar11 == 0) {
      sVar11 = 0;
    }
    else {
      *buffer = pcVar5[(ulong)(ushort)(sVar3 - 2) - 1];
      buffer = buffer + 1;
      sVar11 = sVar11 + -1;
    }
    sVar3 = sVar3 + 1;
  }
  uVar4 = 0;
  if (sVar11 == 0) {
    sVar11 = 0;
  }
  else {
    *buffer = '-';
    buffer = buffer + 1;
    sVar11 = sVar11 + -1;
  }
  uVar9 = 0;
  for (uVar6 = code; uVar6 != 0; uVar6 = (int)uVar6 >> 4) {
    uVar9 = uVar9 + 1;
    uVar4 = uVar4 + 1;
  }
  uVar7 = 4;
  if (4 < (uint)uVar9) {
    uVar7 = (uint)uVar9;
  }
  uVar8 = 4;
  if (4 < uVar9) {
    uVar8 = uVar9;
  }
  while( true ) {
    if (((long)uVar8 < 1 && code == 0) || (sVar11 == 0)) break;
    cVar1 = (char)(code & 0xf);
    cVar10 = cVar1 + '7';
    if ((code & 0xf) < 10) {
      cVar10 = cVar1 + '0';
    }
    buffer[uVar8 - 1] = cVar10;
    code = (int)code >> 4;
    uVar8 = uVar8 - 1;
    sVar11 = sVar11 + -1;
  }
  if (sVar11 != 0) {
    buffer[uVar7] = '>';
  }
  uVar7 = 4;
  if (4 < uVar4) {
    uVar7 = uVar4;
  }
  return sVar3 + (short)uVar7;
}

Assistant:

static uint16_t getExtName(uint32_t code, char *buffer, uint16_t bufferLength) {
    const char *catname = getCharCatName(code);
    uint16_t length = 0;

    UChar32 cp;
    int ndigits, i;
    
    WRITE_CHAR(buffer, bufferLength, length, '<');
    while (catname[length - 1]) {
        WRITE_CHAR(buffer, bufferLength, length, catname[length - 1]);
    }
    WRITE_CHAR(buffer, bufferLength, length, '-');
    for (cp = code, ndigits = 0; cp; ++ndigits, cp >>= 4)
        ;
    if (ndigits < 4)
        ndigits = 4;
    for (cp = code, i = ndigits; (cp || i > 0) && bufferLength; cp >>= 4, bufferLength--) {
        uint8_t v = (uint8_t)(cp & 0xf);
        buffer[--i] = (v < 10 ? '0' + v : 'A' + v - 10);
    }
    buffer += ndigits;
    length += static_cast<uint16_t>(ndigits);
    WRITE_CHAR(buffer, bufferLength, length, '>');

    return length;
}